

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O1

void __thiscall pstore::http::sha1::pad_message(sha1 *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uchar *__s;
  
  uVar1 = this->index_;
  uVar2 = (ulong)uVar1;
  uVar3 = uVar1 + 1;
  (this->message_block_)._M_elems[uVar2] = 0x80;
  if (uVar2 < 0x38) {
    if (uVar3 < 0x38) {
      __s = (this->message_block_)._M_elems + uVar2 + 1;
      iVar4 = 0x36;
      goto LAB_0012bae9;
    }
  }
  else {
    if (uVar3 < 0x40) {
      memset((void *)((long)(this->intermediate_hash_)._M_elems + (ulong)(uVar1 + 0x25)),0,
             (ulong)(0x3e - uVar1) + 1);
      uVar3 = 0x40;
    }
    this->index_ = uVar3;
    process_message_block(this);
    uVar1 = this->index_;
    if (0x37 < (ulong)uVar1) goto LAB_0012baff;
    __s = (this->message_block_)._M_elems + uVar1;
    iVar4 = 0x37;
LAB_0012bae9:
    memset(__s,0,(ulong)(iVar4 - uVar1) + 1);
    uVar3 = 0x38;
  }
  this->index_ = uVar3;
LAB_0012baff:
  uVar2 = this->length_;
  *(ulong *)((this->message_block_)._M_elems + 0x38) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  process_message_block(this);
  return;
}

Assistant:

void sha1::pad_message () noexcept {
            // Note that many of the variable names in this code, especially the single character
            // names, were used because those were the names used in the publication.

            // Check to see if the current message block is too small to hold the initial padding
            // bits and length.  If so, we will pad the block, process it, and then continue padding
            // into a second block.
            if (index_ > 55) {
                message_block_[index_] = 0x80;
                ++index_;

                for (; index_ < 64; ++index_) {
                    message_block_[index_] = 0;
                }

                this->process_message_block ();

                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            } else {
                message_block_[index_] = 0x80;
                ++index_;
                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            }

            // Store the message length as the last 8 octets.
            message_block_[56] = static_cast<std::uint8_t> (length_ >> 56U);
            message_block_[57] = static_cast<std::uint8_t> (length_ >> 48U);
            message_block_[58] = static_cast<std::uint8_t> (length_ >> 40U);
            message_block_[59] = static_cast<std::uint8_t> (length_ >> 32U);
            message_block_[60] = static_cast<std::uint8_t> (length_ >> 24U);
            message_block_[61] = static_cast<std::uint8_t> (length_ >> 16U);
            message_block_[62] = static_cast<std::uint8_t> (length_ >> 8U);
            message_block_[63] = static_cast<std::uint8_t> (length_);

            this->process_message_block ();
        }